

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O3

int LS_ThrustThingZ(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4
                   )

{
  AActor *pAVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = (double)arg1 * 0.25;
  if (arg2 != 0) {
    dVar2 = -dVar2;
  }
  if (arg0 == 0) {
    if (it == (AActor *)0x0) {
      return 0;
    }
    if (arg3 != 0) {
      dVar2 = dVar2 + (it->Vel).Z;
    }
    (it->Vel).Z = dVar2;
  }
  else {
    for (pAVar1 = AActor::TIDHash[arg0 & 0x7f]; pAVar1 != (AActor *)0x0; pAVar1 = pAVar1->inext) {
      if (pAVar1->tid == arg0) {
        dVar3 = dVar2;
        if (arg3 != 0) {
          dVar3 = (pAVar1->Vel).Z + dVar2;
        }
        (pAVar1->Vel).Z = dVar3;
      }
    }
  }
  return 1;
}

Assistant:

FUNC(LS_ThrustThingZ)	// [BC]
// ThrustThingZ (tid, zthrust, down/up, set)
{
	AActor *victim;
	double thrust = arg1/4.;

	// [BC] Up is default
	if (arg2)
		thrust = -thrust;

	if (arg0 != 0)
	{
		FActorIterator iterator (arg0);

		while ( (victim = iterator.Next ()) )
		{
			if (!arg3)
				victim->Vel.Z = thrust;
			else
				victim->Vel.Z += thrust;
		}
		return true;
	}
	else if (it)
	{
		if (!arg3)
			it->Vel.Z = thrust;
		else
			it->Vel.Z += thrust;
		return true;
	}
	return false;
}